

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

void duckdb::FirstFunction<true,false>::
     Operation<int,duckdb::FirstState<int>,duckdb::FirstFunction<true,false>>
               (FirstState<int> *state,int *input,AggregateUnaryInput *unary_input)

{
  bool bVar1;
  
  bVar1 = AggregateUnaryInput::RowIsValid(unary_input);
  if (bVar1) {
    state->value = *input;
  }
  state->is_set = true;
  state->is_null = !bVar1;
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		if (LAST || !state.is_set) {
			if (!unary_input.RowIsValid()) {
				if (!SKIP_NULLS) {
					state.is_set = true;
				}
				state.is_null = true;
			} else {
				state.is_set = true;
				state.is_null = false;
				state.value = input;
			}
		}
	}